

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

bool __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::matches
          (call_matcher<void_(),_std::tuple<>_> *this,call_params_type_t<void_()> *params)

{
  bool bVar1;
  bool local_19;
  call_params_type_t<void_()> *params_local;
  call_matcher<void_(),_std::tuple<>_> *this_local;
  
  bVar1 = match_parameters<>((tuple<> *)&this->field_0x78,params);
  local_19 = false;
  if (bVar1) {
    local_19 = match_conditions(this,params);
  }
  return local_19;
}

Assistant:

bool
    matches(
      call_params_type_t<Sig> const& params)
    const
    override
    {
      return match_parameters(val, params) && match_conditions(params);
    }